

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaIsGlobalItem(xmlSchemaTypePtr item)

{
  xmlSchemaTypePtr item_local;
  
  switch(item->type) {
  case XML_SCHEMA_TYPE_SIMPLE:
  case XML_SCHEMA_TYPE_COMPLEX:
    if ((item->flags & 8U) != 0) {
      return 1;
    }
    break;
  default:
    return 1;
  case XML_SCHEMA_TYPE_ELEMENT:
    if ((item->flags & 2U) != 0) {
      return 1;
    }
    break;
  case XML_SCHEMA_TYPE_ATTRIBUTE:
    if (((ulong)item->facets & 1) != 0) {
      return 1;
    }
    break;
  case XML_SCHEMA_TYPE_GROUP:
    return 1;
  }
  return 0;
}

Assistant:

static int
xmlSchemaIsGlobalItem(xmlSchemaTypePtr item)
{
    switch (item->type) {
	case XML_SCHEMA_TYPE_COMPLEX:
	case XML_SCHEMA_TYPE_SIMPLE:
	    if (item->flags & XML_SCHEMAS_TYPE_GLOBAL)
		return(1);
	    break;
	case XML_SCHEMA_TYPE_GROUP:
	    return (1);
	case XML_SCHEMA_TYPE_ELEMENT:
	    if ( ((xmlSchemaElementPtr) item)->flags &
		XML_SCHEMAS_ELEM_GLOBAL)
		return(1);
	    break;
	case XML_SCHEMA_TYPE_ATTRIBUTE:
	    if ( ((xmlSchemaAttributePtr) item)->flags &
		XML_SCHEMAS_ATTR_GLOBAL)
		return(1);
	    break;
	/* Note that attribute groups are always global. */
	default:
	    return(1);
    }
    return (0);
}